

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

Expr str_from_list(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                  Expr *args,int argc)

{
  _Bool _Var1;
  Expr *__ptr;
  size_t len_00;
  pString value;
  Expr EVar2;
  Expr EVar3;
  Expr expr;
  Expr ptr;
  Expr expr_00;
  Expr expr_01;
  Expr expr_02;
  ulong local_98;
  size_t i;
  pString str;
  size_t res_len;
  Expr *items;
  ValueType local_70;
  int len;
  anon_union_8_8_707b72ea_for_Expr_1 local_68;
  ValueType local_60;
  Expr length;
  Expr list;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  
  if (argc < 2) {
    printf("__str-from-list: too few arguments\n");
    exit(1);
  }
  if (2 < argc) {
    printf("__str-from-list: too many arguments\n");
    exit(1);
  }
  EVar2._4_4_ = 0;
  EVar2.type = args->type;
  EVar2.field_1.val_atom = (args->field_1).val_atom;
  EVar2 = exec_eval(exec,callContext,EVar2);
  expr_02.field_1 = EVar2.field_1;
  length.field_1.val_atom._0_4_ = EVar2.type;
  expr._4_4_ = 0;
  expr.type = args[1].type;
  expr.field_1.val_atom = args[1].field_1.val_atom;
  EVar2 = exec_eval(exec,callContext,expr);
  local_68 = EVar2.field_1;
  local_70 = EVar2.type;
  ptr._4_4_ = 0;
  ptr.type = local_70;
  ptr.field_1.val_atom = local_68.val_atom;
  EVar2 = dereference(ptr);
  length._0_8_ = EVar2.field_1;
  local_60 = EVar2.type;
  expr_02._4_4_ = 0;
  expr_02.type = length.field_1.val_atom._0_4_;
  __ptr = get_list(exec,expr_02,(int *)((long)&items + 4));
  len_00 = longint_to_long((pLongInt)length._0_8_);
  value = string_allocate_memory(len_00);
  local_98 = 0;
  while( true ) {
    if (len_00 <= local_98) {
      free(__ptr);
      EVar2 = make_string(exec,value);
      EVar3.field_1 = EVar2.field_1;
      EVar3.type = EVar2.type;
      free_string(value);
      expr_01._4_4_ = 0;
      expr_01.type = EVar3.type;
      expr_01.field_1.val_atom = EVar3.field_1.val_atom;
      _Var1 = is_none(expr_01);
      if (!_Var1) {
        EVar3._4_4_ = 0;
        return EVar3;
      }
      printf("__str-from-list: make_string failed\n");
      exit(1);
    }
    expr_00._4_4_ = 0;
    expr_00.type = __ptr[local_98].type;
    expr_00.field_1.val_atom = __ptr[local_98].field_1.val_atom;
    _Var1 = is_char(expr_00);
    if (!_Var1) break;
    value->buf[local_98] = __ptr[local_98].field_1.val_char;
    local_98 = local_98 + 1;
  }
  free_string(value);
  printf("__str-from-list: `list` argument must contain only characters\n");
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_from_list)
{
    if (argc < 2)
    {
        log("__str-from-list: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("__str-from-list: too many arguments");
        exit(1);
    }
    // Evaluate all arguments
    Expr list = exec_eval(exec, callContext, args[0]);
    Expr length = dereference(exec_eval(exec, callContext, args[1]));

    int len;
    Expr *items = get_list(exec, list, &len);

    size_t res_len = (size_t) longint_to_long(length.val_int);

    pString str = string_allocate_memory(res_len);
    for (size_t i = 0; i < res_len; i++)
    {
        if (!is_char(items[i]))
        {
            free_string(str);
            log("__str-from-list: `list` argument must contain only characters");
            exit(1);
        }
        str->buf[i] = items[i].val_char;
    }
    free(items);

    Expr res = make_string(exec, str);
    free_string(str);
    if (is_none(res))
    {
        log("__str-from-list: make_string failed");
        exit(1);
    }
    return res;
}